

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm2dot.cpp
# Opt level: O0

ostream * operator<<(ostream *os,fsm_def *sm)

{
  bool bVar1;
  ostream *poVar2;
  reference pbVar3;
  reference t;
  transition *transition;
  iterator __end1_2;
  iterator __begin1_2;
  vector<transition,_std::allocator<transition>_> *__range1_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *option;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *state;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  fsm_def *sm_local;
  ostream *os_local;
  
  poVar2 = std::operator<<(os,"digraph ");
  poVar2 = std::operator<<(poVar2,(string *)&sm->name);
  std::operator<<(poVar2," {\n");
  fsm_def::get_states_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__begin1,sm);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin1);
  state = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&state);
    if (!bVar1) break;
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    poVar2 = std::operator<<(os,"\t");
    poVar2 = std::operator<<(poVar2,(string *)pbVar3);
    std::operator<<(poVar2,";\n");
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__begin1);
  std::operator<<(os,"\n");
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&sm->general_options);
  option = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&sm->general_options);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&option);
    if (!bVar1) break;
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1_1);
    poVar2 = std::operator<<(os,"\t");
    poVar2 = std::operator<<(poVar2,(string *)pbVar3);
    std::operator<<(poVar2,";\n");
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::operator<<(os,"\n");
  __end1_2 = std::vector<transition,_std::allocator<transition>_>::begin(&sm->transitions);
  transition = (transition *)
               std::vector<transition,_std::allocator<transition>_>::end(&sm->transitions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<transition_*,_std::vector<transition,_std::allocator<transition>_>_>
                        *)&transition);
    if (!bVar1) break;
    t = __gnu_cxx::
        __normal_iterator<transition_*,_std::vector<transition,_std::allocator<transition>_>_>::
        operator*(&__end1_2);
    poVar2 = std::operator<<(os,"\t");
    poVar2 = operator<<(poVar2,t);
    std::operator<<(poVar2,"\n");
    __gnu_cxx::
    __normal_iterator<transition_*,_std::vector<transition,_std::allocator<transition>_>_>::
    operator++(&__end1_2);
  }
  std::operator<<(os,"}\n");
  return os;
}

Assistant:

inline std::ostream& operator <<(std::ostream& os,	fsm_def& sm)
{
    os << "digraph " << sm.name << " {\n";
    for (const auto& state : sm.get_states()) {
        os << "\t" << state << ";\n";
    }
    os << "\n";
    for (const auto& option : sm.general_options) {
        os << "\t" << option << ";\n";
    }
    os << "\n";

    for (const auto& transition : sm.transitions) {
        os << "\t" << transition << "\n";
    }
    os << "}\n";
    return os;
}